

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socketio_berkeley.c
# Opt level: O1

void * socketio_CloneOption(char *name,void *value)

{
  int iVar1;
  LOGGER_LOG p_Var2;
  size_t sVar3;
  size_t __size;
  char *pcVar4;
  
  if (name != (char *)0x0) {
    iVar1 = strcmp(name,"net_interface_mac_address");
    if (iVar1 == 0) {
      if (value == (void *)0x0) {
        p_Var2 = xlogging_get_log_function();
        if (p_Var2 == (LOGGER_LOG)0x0) {
          return (void *)0x0;
        }
        pcVar4 = "Failed cloning option %s (value is NULL)";
        iVar1 = 0x7e;
      }
      else {
        sVar3 = strlen((char *)value);
        __size = 0xffffffffffffffff;
        if (sVar3 + 1 != 0) {
          __size = sVar3 + 1;
        }
        if (__size == 0xffffffffffffffff) {
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return (void *)0x0;
          }
          pcVar4 = "Invalid malloc size";
          iVar1 = 0x86;
        }
        else {
          pcVar4 = (char *)malloc(__size);
          if (pcVar4 != (char *)0x0) {
            pcVar4 = strcpy(pcVar4,(char *)value);
            return pcVar4;
          }
          p_Var2 = xlogging_get_log_function();
          if (p_Var2 == (LOGGER_LOG)0x0) {
            return (void *)0x0;
          }
          pcVar4 = "Failed cloning option %s (malloc failed)";
          iVar1 = 0x8a;
        }
      }
    }
    else {
      p_Var2 = xlogging_get_log_function();
      if (p_Var2 == (LOGGER_LOG)0x0) {
        return (void *)0x0;
      }
      pcVar4 = "Cannot clone option %s (not suppported)";
      iVar1 = 0x94;
    }
    (*p_Var2)(AZ_LOG_ERROR,
              "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-c-shared-utility/adapters/socketio_berkeley.c"
              ,"socketio_CloneOption",iVar1,1,pcVar4);
  }
  return (void *)0x0;
}

Assistant:

static void* socketio_CloneOption(const char* name, const void* value)
{
    void* result;

    if (name != NULL)
    {
        result = NULL;

        if (strcmp(name, OPTION_NET_INT_MAC_ADDRESS) == 0)
        {
            if (value == NULL)
            {
                LogError("Failed cloning option %s (value is NULL)", name);
            }
            else
            {
                size_t malloc_size = safe_add_size_t(strlen((char*)value), 1);
                malloc_size = safe_multiply_size_t(malloc_size, sizeof(char));
                if (malloc_size == SIZE_MAX)
                {
                    LogError("Invalid malloc size");
                }
                else if ((result = malloc(malloc_size)) == NULL)
                {
                    LogError("Failed cloning option %s (malloc failed)", name);
                }
                else
                {
                    strcpy((char *)result, (char *)value);
                }
            }
        }
        else
        {
            LogError("Cannot clone option %s (not suppported)", name);
        }
    }
    else
    {
        result = NULL;
    }
    return result;
}